

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ParameterDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ParameterDeclarationSyntax,slang::parsing::Token,slang::syntax::DataTypeSyntax&,slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>&>
          (BumpAllocator *this,Token *args,DataTypeSyntax *args_1,
          SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *args_2)

{
  Token keyword;
  ParameterDeclarationSyntax *this_00;
  
  this_00 = (ParameterDeclarationSyntax *)allocate(this,0x68,8);
  keyword.kind = args->kind;
  keyword._2_1_ = args->field_0x2;
  keyword.numFlags.raw = (args->numFlags).raw;
  keyword.rawLen = args->rawLen;
  keyword.info = args->info;
  slang::syntax::ParameterDeclarationSyntax::ParameterDeclarationSyntax
            (this_00,keyword,args_1,args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }